

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateDocumentInternal(xmlParserCtxtPtr ctxt,xmlValidCtxtPtr vctxt,xmlDocPtr doc)

{
  _xmlDtd *p_Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  xmlChar *in_RAX;
  xmlNodePtr root;
  xmlParserInputPtr input;
  xmlDtdPtr pxVar6;
  xmlParserErrors code;
  char *msg;
  xmlChar *pxVar7;
  xmlChar *sysID;
  
  uVar4 = 0;
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  p_Var1 = doc->intSubset;
  sysID = in_RAX;
  if (p_Var1 == (_xmlDtd *)0x0) {
    if (doc->extSubset != (_xmlDtd *)0x0) goto LAB_0015af85;
    code = XML_DTD_NO_DTD;
    pxVar7 = (xmlChar *)0x0;
    msg = "no DTD found!\n";
    goto LAB_0015b157;
  }
  pxVar7 = p_Var1->SystemID;
  if (((pxVar7 == (xmlChar *)0x0) && (p_Var1->ExternalID == (xmlChar *)0x0)) ||
     (doc->extSubset != (_xmlDtd *)0x0)) goto LAB_0015af85;
  sysID = (xmlChar *)0x0;
  if (pxVar7 == (xmlChar *)0x0) {
LAB_0015b08d:
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      pxVar6 = xmlParseDTD(doc->intSubset->ExternalID,sysID);
      doc->extSubset = pxVar6;
    }
    else {
      input = xmlLoadResource(ctxt,(char *)sysID,(char *)doc->intSubset->ExternalID,XML_RESOURCE_DTD
                             );
      if (input == (xmlParserInputPtr)0x0) {
        (*xmlFree)(sysID);
        return 0;
      }
      pxVar6 = xmlCtxtParseDtd(ctxt,input,doc->intSubset->ExternalID,sysID);
      doc->extSubset = pxVar6;
    }
    if (sysID != (xmlChar *)0x0) {
      (*xmlFree)(sysID);
    }
    if (doc->extSubset != (_xmlDtd *)0x0) {
LAB_0015af85:
      if ((xmlHashTablePtr)doc->ids != (xmlHashTablePtr)0x0) {
        xmlHashFree((xmlHashTablePtr)doc->ids,xmlFreeIDTableEntry);
        doc->ids = (void *)0x0;
      }
      if ((xmlHashTablePtr)doc->refs != (xmlHashTablePtr)0x0) {
        xmlHashFree((xmlHashTablePtr)doc->refs,xmlFreeRefTableEntry);
        doc->refs = (void *)0x0;
      }
      uVar2 = xmlValidateDtdFinal(vctxt,doc);
      iVar3 = xmlValidateRoot(vctxt,doc);
      if (iVar3 != 0) {
        root = xmlDocGetRootElement(doc);
        uVar4 = xmlValidateElement(vctxt,doc,root);
        uVar5 = xmlValidateDocumentFinal(vctxt,doc);
        uVar4 = uVar2 & uVar5 & uVar4;
      }
      return uVar4;
    }
    pxVar7 = doc->intSubset->SystemID;
    if (pxVar7 == (xmlChar *)0x0) {
      pxVar7 = doc->intSubset->ExternalID;
    }
    msg = "Could not load the external subset \"%s\"\n";
  }
  else {
    iVar3 = xmlBuildURISafe(pxVar7,doc->URL,&sysID);
    if (iVar3 < 0) {
      xmlVErrMemory(vctxt);
      return 0;
    }
    if (iVar3 == 0) goto LAB_0015b08d;
    pxVar7 = doc->intSubset->SystemID;
    msg = "Could not build URI for external subset \"%s\"\n";
  }
  code = XML_DTD_LOAD_ERROR;
LAB_0015b157:
  xmlDoErrValid(vctxt,(xmlNodePtr)0x0,code,2,pxVar7,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,pxVar7);
  return 0;
}

Assistant:

static int
xmlValidateDocumentInternal(xmlParserCtxtPtr ctxt, xmlValidCtxtPtr vctxt,
                            xmlDocPtr doc) {
    int ret;
    xmlNodePtr root;

    if (doc == NULL)
        return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        xmlErrValid(vctxt, XML_DTD_NO_DTD,
	            "no DTD found!\n", NULL);
	return(0);
    }

    if ((doc->intSubset != NULL) && ((doc->intSubset->SystemID != NULL) ||
	(doc->intSubset->ExternalID != NULL)) && (doc->extSubset == NULL)) {
	xmlChar *sysID = NULL;

	if (doc->intSubset->SystemID != NULL) {
            int res;

            res = xmlBuildURISafe(doc->intSubset->SystemID, doc->URL, &sysID);
            if (res < 0) {
                xmlVErrMemory(vctxt);
                return 0;
            } else if (res != 0) {
                xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
			"Could not build URI for external subset \"%s\"\n",
			(const char *) doc->intSubset->SystemID);
		return 0;
	    }
	}

        if (ctxt != NULL) {
            xmlParserInputPtr input;

            input = xmlLoadResource(ctxt, (const char *) sysID,
                    (const char *) doc->intSubset->ExternalID,
                    XML_RESOURCE_DTD);
            if (input == NULL) {
                xmlFree(sysID);
                return 0;
            }

            doc->extSubset = xmlCtxtParseDtd(ctxt, input,
                                             doc->intSubset->ExternalID,
                                             sysID);
        } else {
            doc->extSubset = xmlParseDTD(doc->intSubset->ExternalID, sysID);
        }

	if (sysID != NULL)
	    xmlFree(sysID);
        if (doc->extSubset == NULL) {
	    if (doc->intSubset->SystemID != NULL) {
		xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
		       "Could not load the external subset \"%s\"\n",
		       (const char *) doc->intSubset->SystemID);
	    } else {
		xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
		       "Could not load the external subset \"%s\"\n",
		       (const char *) doc->intSubset->ExternalID);
	    }
	    return(0);
	}
    }

    if (doc->ids != NULL) {
          xmlFreeIDTable(doc->ids);
          doc->ids = NULL;
    }
    if (doc->refs != NULL) {
          xmlFreeRefTable(doc->refs);
          doc->refs = NULL;
    }
    ret = xmlValidateDtdFinal(vctxt, doc);
    if (!xmlValidateRoot(vctxt, doc)) return(0);

    root = xmlDocGetRootElement(doc);
    ret &= xmlValidateElement(vctxt, doc, root);
    ret &= xmlValidateDocumentFinal(vctxt, doc);
    return(ret);
}